

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int create_esni_aead(ptls_aead_context_t **aead_ctx,int is_enc,ptls_cipher_suite_t *cipher,
                    ptls_iovec_t ecdh_secret,uint8_t *esni_contents_hash)

{
  int iVar1;
  ptls_aead_context_t *ppVar2;
  ptls_iovec_t hash_value;
  uint8_t aead_secret [64];
  undefined1 local_78 [72];
  
  iVar1 = ptls_hkdf_extract(cipher->hash,local_78,(ptls_iovec_t)ZEXT816(0),ecdh_secret);
  if (iVar1 == 0) {
    hash_value.len = cipher->hash->digest_size;
    hash_value.base = esni_contents_hash;
    ppVar2 = new_aead(cipher->aead,cipher->hash,is_enc,local_78,hash_value,"tls13 esni ");
    *aead_ctx = ppVar2;
    iVar1 = 0;
    if (ppVar2 == (ptls_aead_context_t *)0x0) {
      iVar1 = 0x201;
    }
  }
  (*ptls_clear_memory)(local_78,0x40);
  return iVar1;
}

Assistant:

static int create_esni_aead(ptls_aead_context_t **aead_ctx, int is_enc, ptls_cipher_suite_t *cipher, ptls_iovec_t ecdh_secret,
                            const uint8_t *esni_contents_hash)
{
    uint8_t aead_secret[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if ((ret = ptls_hkdf_extract(cipher->hash, aead_secret, ptls_iovec_init(NULL, 0), ecdh_secret)) != 0)
        goto Exit;
    if ((*aead_ctx = new_aead(cipher->aead, cipher->hash, is_enc, aead_secret,
                              ptls_iovec_init(esni_contents_hash, cipher->hash->digest_size), "tls13 esni ")) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    ret = 0;
Exit:
    ptls_clear_memory(aead_secret, sizeof(aead_secret));
    return ret;
}